

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_avx2.c
# Opt level: O0

void final_filter_fast(int32_t *dst,int dst_stride,int32_t *A,int32_t *B,int buf_stride,void *dgd8,
                      int dgd_stride,int width,int height,int highbd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  __m256i v_00;
  __m256i v_01;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  long in_R9;
  ulong in_XMM0_Qa;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 in_XMM0_Qb;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 in_YMM0_H;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 in_register_00001218;
  undefined8 uVar20;
  undefined8 uVar21;
  int in_stack_00000008;
  __m256i w_1;
  __m256i v_1;
  __m256i src_1;
  __m128i raw_1;
  __m256i b_1;
  __m256i a_1;
  int j_1;
  __m256i w;
  __m256i v;
  __m256i src;
  __m128i raw;
  __m256i b;
  __m256i a;
  int j;
  int i;
  uint8_t *dgd_real;
  __m256i rounding1;
  __m256i rounding0;
  int nb1;
  int nb0;
  undefined8 in_stack_fffffffffffffae0;
  undefined8 in_stack_fffffffffffffae8;
  uint in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  undefined8 uStack_508;
  undefined1 in_stack_fffffffffffffb00 [32];
  long local_4c8;
  ulong local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  int32_t *in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffc04;
  int32_t *in_stack_fffffffffffffc08;
  int local_3e4;
  ulong local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  int local_310;
  uint local_30c;
  
  round_for_shift(in_stack_fffffffffffffaf0);
  uVar12 = in_XMM0_Qa;
  uVar15 = in_XMM0_Qb;
  uVar18 = in_YMM0_H;
  uVar20 = in_register_00001218;
  round_for_shift(in_stack_fffffffffffffaf0);
  local_4c8 = in_R9;
  if (height != 0) {
    local_4c8 = in_R9 << 1;
  }
  local_3e0 = uVar12;
  uStack_3d8 = uVar15;
  uStack_3d0 = uVar18;
  uStack_3c8 = uVar20;
  for (local_30c = 0; (int)local_30c < width; local_30c = local_30c + 1) {
    if ((local_30c & 1) == 0) {
      for (local_310 = 0; local_310 < dgd_stride; local_310 = local_310 + 8) {
        cross_sum_fast_even_row(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
        uVar13 = local_3e0;
        uVar16 = uStack_3d8;
        uVar19 = uStack_3d0;
        uVar21 = uStack_3c8;
        cross_sum_fast_even_row(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
        uVar14 = uVar13;
        uVar17 = uVar16;
        xx_loadu_128((void *)(local_4c8 +
                             (int)(local_30c * in_stack_00000008 + local_310 <<
                                  ((byte)height & 0x1f))));
        if (height == 0) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar14;
          in_stack_fffffffffffffb00 = vpmovzxbd_avx2(auVar1);
        }
        else {
          auVar5._8_8_ = uVar17;
          auVar5._0_8_ = uVar14;
          in_stack_fffffffffffffb00 = vpmovzxwd_avx2(auVar5);
        }
        auVar11._8_8_ = uStack_3d8;
        auVar11._0_8_ = local_3e0;
        auVar11._16_8_ = uStack_3d0;
        auVar11._24_8_ = uStack_3c8;
        auVar3 = vpmaddwd_avx2(auVar11,in_stack_fffffffffffffb00);
        auVar9._8_8_ = uVar16;
        auVar9._0_8_ = uVar13;
        auVar9._16_8_ = uVar19;
        auVar9._24_8_ = uVar21;
        auVar3 = vpaddd_avx2(auVar3,auVar9);
        auVar8._8_8_ = in_XMM0_Qb;
        auVar8._0_8_ = in_XMM0_Qa;
        auVar8._16_8_ = in_YMM0_H;
        auVar8._24_8_ = in_register_00001218;
        auVar3 = vpaddd_avx2(auVar3,auVar8);
        auVar3 = vpsrad_avx2(auVar3,ZEXT416(9));
        local_3e0 = auVar3._0_8_;
        uStack_3d8 = auVar3._8_8_;
        uStack_3d0 = auVar3._16_8_;
        uStack_3c8 = auVar3._24_8_;
        v_00[1] = in_stack_fffffffffffffae0;
        v_00[0] = 0xa1cffd;
        v_00[2] = in_stack_fffffffffffffae8;
        v_00[3]._0_4_ = in_stack_fffffffffffffaf0;
        v_00[3]._4_4_ = in_stack_fffffffffffffaf4;
        yy_storeu_256(in_stack_fffffffffffffb00._16_8_,v_00);
      }
    }
    else {
      for (local_3e4 = 0; local_3e4 < dgd_stride; local_3e4 = local_3e4 + 8) {
        cross_sum_fast_odd_row(in_stack_fffffffffffffba8);
        uVar13 = local_3e0;
        uVar16 = uStack_3d8;
        uVar19 = uStack_3d0;
        uVar21 = uStack_3c8;
        cross_sum_fast_odd_row(in_stack_fffffffffffffba8);
        uVar14 = uVar13;
        uVar17 = uVar16;
        xx_loadu_128((void *)(local_4c8 +
                             (int)(local_30c * in_stack_00000008 + local_3e4 <<
                                  ((byte)height & 0x1f))));
        if (height == 0) {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar14;
          auVar3 = vpmovzxbd_avx2(auVar2);
          in_stack_fffffffffffffae0 = auVar3._0_8_;
          in_stack_fffffffffffffae8 = auVar3._8_8_;
          in_stack_fffffffffffffaf0 = auVar3._16_4_;
          in_stack_fffffffffffffaf4 = auVar3._20_4_;
          uStack_508 = auVar3._24_8_;
        }
        else {
          auVar4._8_8_ = uVar17;
          auVar4._0_8_ = uVar14;
          auVar3 = vpmovzxwd_avx2(auVar4);
          in_stack_fffffffffffffae0 = auVar3._0_8_;
          in_stack_fffffffffffffae8 = auVar3._8_8_;
          in_stack_fffffffffffffaf0 = auVar3._16_4_;
          in_stack_fffffffffffffaf4 = auVar3._20_4_;
          uStack_508 = auVar3._24_8_;
        }
        auVar3._20_4_ = in_stack_fffffffffffffaf4;
        auVar3._16_4_ = in_stack_fffffffffffffaf0;
        auVar10._8_8_ = uStack_3d8;
        auVar10._0_8_ = local_3e0;
        auVar10._16_8_ = uStack_3d0;
        auVar10._24_8_ = uStack_3c8;
        auVar3._8_8_ = in_stack_fffffffffffffae8;
        auVar3._0_8_ = in_stack_fffffffffffffae0;
        auVar3._24_8_ = uStack_508;
        auVar3 = vpmaddwd_avx2(auVar10,auVar3);
        auVar7._8_8_ = uVar16;
        auVar7._0_8_ = uVar13;
        auVar7._16_8_ = uVar19;
        auVar7._24_8_ = uVar21;
        auVar3 = vpaddd_avx2(auVar3,auVar7);
        auVar6._8_8_ = uVar15;
        auVar6._0_8_ = uVar12;
        auVar6._16_8_ = uVar18;
        auVar6._24_8_ = uVar20;
        auVar3 = vpaddd_avx2(auVar3,auVar6);
        auVar3 = vpsrad_avx2(auVar3,ZEXT416(8));
        local_4c0 = auVar3._0_8_;
        uStack_4b8 = auVar3._8_8_;
        uStack_4b0 = auVar3._16_8_;
        uStack_4a8 = auVar3._24_8_;
        v_01[1] = in_stack_fffffffffffffae0;
        v_01[0] = 0xa1d258;
        v_01[2] = in_stack_fffffffffffffae8;
        v_01[3]._0_4_ = in_stack_fffffffffffffaf0;
        v_01[3]._4_4_ = in_stack_fffffffffffffaf4;
        local_3e0 = local_4c0;
        uStack_3d8 = uStack_4b8;
        uStack_3d0 = uStack_4b0;
        uStack_3c8 = uStack_4a8;
        yy_storeu_256(in_stack_fffffffffffffb00._16_8_,v_01);
      }
    }
  }
  return;
}

Assistant:

static void final_filter_fast(int32_t *dst, int dst_stride, const int32_t *A,
                              const int32_t *B, int buf_stride,
                              const void *dgd8, int dgd_stride, int width,
                              int height, int highbd) {
  const int nb0 = 5;
  const int nb1 = 4;

  const __m256i rounding0 =
      round_for_shift(SGRPROJ_SGR_BITS + nb0 - SGRPROJ_RST_BITS);
  const __m256i rounding1 =
      round_for_shift(SGRPROJ_SGR_BITS + nb1 - SGRPROJ_RST_BITS);

  const uint8_t *dgd_real =
      highbd ? (const uint8_t *)CONVERT_TO_SHORTPTR(dgd8) : dgd8;

  for (int i = 0; i < height; ++i) {
    if (!(i & 1)) {  // even row
      for (int j = 0; j < width; j += 8) {
        const __m256i a =
            cross_sum_fast_even_row(A + i * buf_stride + j, buf_stride);
        const __m256i b =
            cross_sum_fast_even_row(B + i * buf_stride + j, buf_stride);

        const __m128i raw =
            xx_loadu_128(dgd_real + ((i * dgd_stride + j) << highbd));
        const __m256i src =
            highbd ? _mm256_cvtepu16_epi32(raw) : _mm256_cvtepu8_epi32(raw);

        __m256i v = _mm256_add_epi32(_mm256_madd_epi16(a, src), b);
        __m256i w =
            _mm256_srai_epi32(_mm256_add_epi32(v, rounding0),
                              SGRPROJ_SGR_BITS + nb0 - SGRPROJ_RST_BITS);

        yy_storeu_256(dst + i * dst_stride + j, w);
      }
    } else {  // odd row
      for (int j = 0; j < width; j += 8) {
        const __m256i a = cross_sum_fast_odd_row(A + i * buf_stride + j);
        const __m256i b = cross_sum_fast_odd_row(B + i * buf_stride + j);

        const __m128i raw =
            xx_loadu_128(dgd_real + ((i * dgd_stride + j) << highbd));
        const __m256i src =
            highbd ? _mm256_cvtepu16_epi32(raw) : _mm256_cvtepu8_epi32(raw);

        __m256i v = _mm256_add_epi32(_mm256_madd_epi16(a, src), b);
        __m256i w =
            _mm256_srai_epi32(_mm256_add_epi32(v, rounding1),
                              SGRPROJ_SGR_BITS + nb1 - SGRPROJ_RST_BITS);

        yy_storeu_256(dst + i * dst_stride + j, w);
      }
    }
  }
}